

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O1

el_action_t em_copy_prev_word(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  el_action_t eVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  
  pwVar1 = (el->el_line).buffer;
  pwVar5 = (el->el_line).cursor;
  if (pwVar5 == pwVar1) {
    eVar3 = '\x06';
  }
  else {
    pwVar4 = c__prev_word(pwVar5,pwVar1,(el->el_state).argument,ce__isword);
    c_insert(el,(wchar_t)((ulong)((long)(el->el_line).cursor - (long)pwVar4) >> 2));
    pwVar1 = (el->el_line).cursor;
    pwVar5 = pwVar1;
    if (pwVar4 < pwVar1) {
      pwVar2 = (el->el_line).lastchar;
      do {
        if (pwVar2 <= pwVar5) break;
        *pwVar5 = *pwVar4;
        pwVar5 = pwVar5 + 1;
        pwVar4 = pwVar4 + 1;
      } while (pwVar4 < pwVar1);
    }
    (el->el_line).cursor = pwVar5;
    eVar3 = '\x04';
  }
  return eVar3;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_copy_prev_word(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *cp, *oldc, *dp;

	if (el->el_line.cursor == el->el_line.buffer)
		return CC_ERROR;

	/* does a bounds check */
	cp = c__prev_word(el->el_line.cursor, el->el_line.buffer,
	    el->el_state.argument, ce__isword);

	c_insert(el, (int)(el->el_line.cursor - cp));
	oldc = el->el_line.cursor;
	for (dp = oldc; cp < oldc && dp < el->el_line.lastchar; cp++)
		*dp++ = *cp;

	el->el_line.cursor = dp;/* put cursor at end */

	return CC_REFRESH;
}